

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_parser_parseBlockExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  int iVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t sourcePosition;
  char *pcVar7;
  sysbvm_tuple_t sVar8;
  size_t sVar9;
  bool bVar10;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0xd) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    bVar10 = false;
    sVar6 = 0;
    while (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x12) {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 == 0x12) {
        sVar9 = state->tokenPosition;
        state->tokenPosition = sVar9 + 1;
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        sVar5 = 0xf;
        if (iVar1 == 0x11) {
          state->tokenPosition = state->tokenPosition + 1;
          sVar5 = 0x1f;
        }
        iVar1 = sysbvm_parser_lookKindAt(state,0);
        sVar8 = 0;
        if (iVar1 == 9) {
          state->tokenPosition = state->tokenPosition + 1;
          sVar8 = sysbvm_parser_parseCommaExpression(context,state);
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          if (iVar1 == 10) {
            state->tokenPosition = state->tokenPosition + 1;
            goto LAB_0012b0a0;
          }
          sVar5 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          pcVar7 = "Expected a right parentheses that specifies the type.";
        }
        else {
LAB_0012b0a0:
          iVar1 = sysbvm_parser_lookKindAt(state,0);
          if (iVar1 == 2) {
            sVar3 = sysbvm_parser_parseLiteralTokenValue(context,state);
            sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                              (context,state->sourceCode,state->tokenSequence,sVar9,
                               state->tokenPosition);
            sVar5 = sysbvm_astArgumentNode_create(context,sVar4,sVar5,sVar3,sVar8);
            goto LAB_0012b14e;
          }
          sVar5 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          pcVar7 = "Expected an identifier with the argument name.";
        }
        sVar5 = sysbvm_astErrorNode_createWithCString(context,sVar5,pcVar7);
      }
      else {
        sVar5 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        sVar5 = sysbvm_astErrorNode_createWithCString
                          (context,sVar5,"Expected a colon to delimit a block argument.");
      }
LAB_0012b14e:
      if (!bVar10) {
        sVar6 = sysbvm_orderedCollection_create(context);
        bVar10 = true;
      }
      sysbvm_orderedCollection_add(context,sVar6,sVar5);
    }
    sVar5 = 0xb;
    if ((bVar10) && (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 0x19)) {
      state->tokenPosition = state->tokenPosition + 1;
      sVar5 = 0x2b;
    }
    sVar8 = 0;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0x13) {
      state->tokenPosition = state->tokenPosition + 1;
      sVar8 = sysbvm_parser_parseUnaryExpression(context,state);
    }
    iVar2 = sysbvm_parser_lookKindAt(state,0);
    if (iVar2 == 0x14) {
      sVar9 = state->tokenPosition + 1;
      state->tokenPosition = sVar9;
    }
    else {
      if (iVar1 == 0x13) {
        sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        pcVar7 = "Expected a lambda block back.";
        goto LAB_0012b303;
      }
      sVar9 = state->tokenPosition;
    }
    sVar3 = sysbvm_parser_parsePragmaList(context,state);
    sVar4 = sysbvm_parser_parseExpressionListUntil(context,state,SYSBVM_TOKEN_KIND_RCBRACKET);
    sourcePosition =
         sysbvm_parser_makeSourcePositionForTokenRange
                   (context,state->sourceCode,state->tokenSequence,sVar9,state->tokenPosition);
    sVar3 = sysbvm_astSequenceNode_create(context,sourcePosition,sVar3,sVar4);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0xe) {
      sVar9 = state->tokenPosition + 1;
      state->tokenPosition = sVar9;
      sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,startIndex,sVar9);
      if (iVar2 != 0x14) {
        sVar6 = sysbvm_astLexicalBlockNode_create(context,sVar4,sVar3);
        return sVar6;
      }
      if (sVar6 == 0) {
        sVar6 = sysbvm_orderedCollection_create(context);
      }
      sVar6 = sysbvm_orderedCollection_asArray(context,sVar6);
      sVar6 = sysbvm_astLambdaNode_create(context,sVar4,sVar5,sVar6,sVar8,sVar3);
      return sVar6;
    }
    sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    pcVar7 = "Expected a right curly bracket.";
  }
  else {
    sVar6 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    pcVar7 = "Expected a left curly bracket.";
  }
LAB_0012b303:
  sVar6 = sysbvm_astErrorNode_createWithCString(context,sVar6,pcVar7);
  return sVar6;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseBlockExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
   if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a left curly bracket.");

    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t argumentList = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t resultTypeExpression = SYSBVM_NULL_TUPLE;
    bool hasArguments = false;
    bool hasEllipsis = false;
    bool hasResultType = false;
    bool hasBlockBar = false;
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON)
    {
        sysbvm_tuple_t argument = sysbvm_parser_parseBlockArgument(context, state);

        if(!hasArguments)
        {
            argumentList = sysbvm_orderedCollection_create(context);
            hasArguments = true;
        }

        sysbvm_orderedCollection_add(context, argumentList, argument);
    }

    if(hasArguments && sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_ELLIPSIS)
    {
        hasEllipsis = true;
        ++state->tokenPosition;
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON_COLON)
    {
        ++state->tokenPosition;
        hasResultType = true;
        resultTypeExpression = sysbvm_parser_parseUnaryExpression(context, state);
    }

    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_BAR)
    {
        hasBlockBar = true;
        ++state->tokenPosition;
    }

    if((hasBlockBar || hasResultType) && !hasBlockBar)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a lambda block back.");

    bool isLambda = hasBlockBar;

    sysbvm_tuple_t sequenceNode = sysbvm_parser_parseSequenceUntil(context, state, SYSBVM_TOKEN_KIND_RCBRACKET);

    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_RCBRACKET)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a right curly bracket.");

    ++state->tokenPosition;
    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);

    if(isLambda)
    {
        if(!argumentList)
            argumentList = sysbvm_orderedCollection_create(context);

        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(hasEllipsis ? SYSBVM_FUNCTION_FLAGS_VARIADIC : SYSBVM_FUNCTION_FLAGS_NONE);
        return sysbvm_astLambdaNode_create(context, sourcePosition, flags,
            sysbvm_orderedCollection_asArray(context, argumentList),
            resultTypeExpression, sequenceNode);
    }
    else
    {
        return sysbvm_astLexicalBlockNode_create(context, sourcePosition, sequenceNode);
    }
}